

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O1

void DrawPoly(Vector2 center,int sides,float radius,float rotation,Color color)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float __x;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  
  uVar1 = 3;
  if (3 < sides) {
    uVar1 = sides;
  }
  rlCheckRenderBatchLimit((int)(0x168 / (ulong)uVar1) * 4);
  rlPushMatrix();
  local_48 = center.x;
  uStack_44 = center.y;
  local_4c = 0.0;
  rlTranslatef(local_48,uStack_44,0.0);
  rlRotatef(rotation,0.0,0.0,1.0);
  rlSetTexture(texShapes.id);
  rlBegin(7);
  fVar2 = (float)(int)uVar1;
  do {
    rlColor4ub(color.r,color.g,color.b,color.a);
    rlTexCoord2f(texShapesRec.x / (float)texShapes.width,texShapesRec.y / (float)texShapes.height);
    rlVertex2f(0.0,0.0);
    rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                 (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
    __x = local_4c * 0.017453292;
    fVar3 = sinf(__x);
    fVar4 = cosf(__x);
    rlVertex2f(fVar3 * radius,fVar4 * radius);
    rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                 (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
    fVar3 = sinf(__x);
    fVar4 = cosf(__x);
    rlVertex2f(fVar3 * radius,fVar4 * radius);
    local_4c = local_4c + 360.0 / fVar2;
    rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                 texShapesRec.y / (float)texShapes.height);
    fVar3 = sinf(local_4c * 0.017453292);
    fVar4 = cosf(local_4c * 0.017453292);
    rlVertex2f(fVar3 * radius,fVar4 * radius);
    uVar1 = uVar1 - 1;
  } while (uVar1 != 0);
  rlEnd();
  rlSetTexture(0);
  rlPopMatrix();
  return;
}

Assistant:

void DrawPoly(Vector2 center, int sides, float radius, float rotation, Color color)
{
    if (sides < 3) sides = 3;
    float centralAngle = 0.0f;

    rlCheckRenderBatchLimit(4*(360/sides));

    rlPushMatrix();
        rlTranslatef(center.x, center.y, 0.0f);
        rlRotatef(rotation, 0.0f, 0.0f, 1.0f);

#if defined(SUPPORT_QUADS_DRAW_MODE)
        rlSetTexture(texShapes.id);

        rlBegin(RL_QUADS);
            for (int i = 0; i < sides; i++)
            {
                rlColor4ub(color.r, color.g, color.b, color.a);

                rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
                rlVertex2f(0, 0);

                rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
                rlVertex2f(sinf(DEG2RAD*centralAngle)*radius, cosf(DEG2RAD*centralAngle)*radius);

                rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
                rlVertex2f(sinf(DEG2RAD*centralAngle)*radius, cosf(DEG2RAD*centralAngle)*radius);

                centralAngle += 360.0f/(float)sides;
                rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
                rlVertex2f(sinf(DEG2RAD*centralAngle)*radius, cosf(DEG2RAD*centralAngle)*radius);
            }
        rlEnd();
        rlSetTexture(0);
#else
        rlBegin(RL_TRIANGLES);
            for (int i = 0; i < sides; i++)
            {
                rlColor4ub(color.r, color.g, color.b, color.a);

                rlVertex2f(0, 0);
                rlVertex2f(sinf(DEG2RAD*centralAngle)*radius, cosf(DEG2RAD*centralAngle)*radius);

                centralAngle += 360.0f/(float)sides;
                rlVertex2f(sinf(DEG2RAD*centralAngle)*radius, cosf(DEG2RAD*centralAngle)*radius);
            }
        rlEnd();
#endif
    rlPopMatrix();
}